

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# co_routine.cpp
# Opt level: O1

int co_cond_timedwait(stCoCond_t *link,int ms)

{
  long lVar1;
  stCoCondItem_t *psVar2;
  stCoRoutine_t *pending_co;
  stCoRoutine_t *curr;
  int iVar3;
  stCoCondItem_t *ap;
  void *pvVar4;
  unsigned_long_long allNow;
  long in_FS_OFFSET;
  timeval now;
  timeval local_38;
  
  ap = (stCoCondItem_t *)calloc(1,0x58);
  lVar1 = *(long *)(in_FS_OFFSET + -0x10);
  if (lVar1 == 0) {
    pvVar4 = (void *)0x0;
  }
  else {
    pvVar4 = *(void **)(lVar1 + -8 + (long)*(int *)(lVar1 + 0x400) * 8);
  }
  (ap->timeout).pArg = pvVar4;
  (ap->timeout).pfnProcess = OnSignalProcessEvent;
  if (0 < ms) {
    local_38.tv_sec = 0;
    local_38.tv_usec = 0;
    gettimeofday(&local_38,(__timezone_ptr_t)0x0);
    allNow = local_38.tv_usec / 1000 + local_38.tv_sec * 1000;
    (ap->timeout).ullExpireTime = (uint)ms + allNow;
    iVar3 = AddTimeout(*(stTimeout_t **)(*(long *)(*(long *)(in_FS_OFFSET + -0x10) + 0x408) + 8),
                       &ap->timeout,allNow);
    if (iVar3 != 0) goto LAB_001071fe;
  }
  if (ap->pLink == (stCoCond_t *)0x0) {
    psVar2 = link->tail;
    if (psVar2 == (stCoCondItem_t *)0x0) {
      link->tail = ap;
      link->head = ap;
      ap->pPrev = (stCoCondItem_t *)0x0;
      ap->pNext = (stCoCondItem_t *)0x0;
    }
    else {
      psVar2->pNext = ap;
      ap->pNext = (stCoCondItem_t *)0x0;
      ap->pPrev = psVar2;
      link->tail = ap;
    }
    ap->pLink = link;
  }
  lVar1 = *(long *)(in_FS_OFFSET + -0x10);
  iVar3 = *(int *)(lVar1 + 0x400);
  pending_co = *(stCoRoutine_t **)(lVar1 + -0x10 + (long)iVar3 * 8);
  curr = *(stCoRoutine_t **)(lVar1 + -8 + (long)iVar3 * 8);
  *(int *)(lVar1 + 0x400) = iVar3 + -1;
  co_swap(curr,pending_co);
  RemoveFromLink<stCoCondItem_t,stCoCond_t>(ap);
  iVar3 = 0;
LAB_001071fe:
  free(ap);
  return iVar3;
}

Assistant:

int co_cond_timedwait( stCoCond_t *link,int ms )
{
	stCoCondItem_t* psi = (stCoCondItem_t*)calloc(1, sizeof(stCoCondItem_t));
	psi->timeout.pArg = GetCurrThreadCo();
	psi->timeout.pfnProcess = OnSignalProcessEvent;

	if( ms > 0 )
	{
		unsigned long long now = GetTickMS();
		psi->timeout.ullExpireTime = now + ms;

		int ret = AddTimeout( co_get_curr_thread_env()->pEpoll->pTimeout,&psi->timeout,now );
		if( ret != 0 )
		{
			free(psi);
			return ret;
		}
	}
	AddTail( link, psi);

	co_yield_ct();


	RemoveFromLink<stCoCondItem_t,stCoCond_t>( psi );
	free(psi);

	return 0;
}